

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O3

void __thiscall ipx::SparseMatrix::add_column(SparseMatrix *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  iterator __position;
  size_t sVar4;
  int min_capacity;
  Int nznew;
  int local_1c;
  
  iVar1 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  min_capacity = (int)((ulong)((long)(this->rowidx_queue_).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->rowidx_queue_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2) + iVar1;
  local_1c = min_capacity;
  reserve(this,min_capacity);
  piVar2 = (this->rowidx_queue_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(this->rowidx_queue_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (sVar4 != 0) {
    memmove((this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + iVar1,piVar2,sVar4);
  }
  pdVar3 = (this->values_queue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(this->values_queue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3;
  if (sVar4 != 0) {
    memmove((this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + iVar1,pdVar3,sVar4);
  }
  __position._M_current =
       (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (__position._M_current ==
      (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->colptr_,__position,&local_1c);
  }
  else {
    *__position._M_current = min_capacity;
    (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  piVar2 = (this->rowidx_queue_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->rowidx_queue_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->rowidx_queue_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  pdVar3 = (this->values_queue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->values_queue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    (this->values_queue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar3;
  }
  return;
}

Assistant:

void SparseMatrix::add_column() {
    Int nz = entries();
    Int nznew = nz + queue_size();
    reserve(nznew);
    std::copy(rowidx_queue_.begin(), rowidx_queue_.end(), rowidx_.begin() + nz);
    std::copy(values_queue_.begin(), values_queue_.end(), values_.begin() + nz);
    colptr_.push_back(nznew);
    clear_queue();
}